

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriter::BeginSubsection(BinaryWriter *this,char *name)

{
  Offset OVar1;
  size_t sVar2;
  char *name_local;
  BinaryWriter *this_local;
  
  if (this->last_subsection_leb_size_guess_ == 0) {
    this->last_subsection_leb_size_guess_ = 1;
    OVar1 = WriteU32Leb128Space(this,1,"subsection size (guess)");
    this->last_subsection_offset_ = OVar1;
    sVar2 = Stream::offset(this->stream_);
    this->last_subsection_payload_offset_ = sVar2;
    return;
  }
  __assert_fail("last_subsection_leb_size_guess_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-writer.cc"
                ,0x20f,
                "void wabt::(anonymous namespace)::BinaryWriter::BeginSubsection(const char *)");
}

Assistant:

void BinaryWriter::BeginSubsection(const char* name) {
  assert(last_subsection_leb_size_guess_ == 0);
  last_subsection_leb_size_guess_ = LEB_SECTION_SIZE_GUESS;
  last_subsection_offset_ =
      WriteU32Leb128Space(LEB_SECTION_SIZE_GUESS, "subsection size (guess)");
  last_subsection_payload_offset_ = stream_->offset();
}